

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.c
# Opt level: O0

void * ringbuf_trydequeue(ringbuf *rbuf)

{
  int iVar1;
  void *data;
  ringbuf *rbuf_local;
  
  iVar1 = util_semaphore_trywait(&(rbuf->field_3).nused);
  if (iVar1 == 0) {
    if (rbuf->running == 0) {
      rbuf_local = (ringbuf *)0x0;
    }
    else {
      rbuf_local = (ringbuf *)ringbuf_dequeue_atomic(rbuf);
      util_semaphore_post(&(rbuf->field_2).nfree);
    }
  }
  else {
    rbuf_local = (ringbuf *)0x0;
  }
  return rbuf_local;
}

Assistant:

void *
ringbuf_trydequeue(struct ringbuf *rbuf)
{
	LOG(4, NULL);

	if (util_semaphore_trywait(&rbuf->nused) != 0)
		return NULL;

	if (!rbuf->running)
		return NULL;

	void *data = ringbuf_dequeue_atomic(rbuf);

	util_semaphore_post(&rbuf->nfree);

	return data;
}